

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O1

double statement(void)

{
  bool is_const;
  undefined8 uVar1;
  long *unaff_R14;
  double d;
  Token t;
  Token local_98;
  string local_68;
  undefined1 local_48 [16];
  long *local_38;
  long local_28 [3];
  
  Token_stream::get(&local_98,&ts);
  if (local_98.kind == 'C') {
    is_const = true;
  }
  else {
    if (local_98.kind != '#') {
      local_48._1_7_ = local_98._1_7_;
      local_48[0] = local_98.kind;
      local_48._8_8_ = local_98.value;
      unaff_R14 = local_28;
      local_38 = unaff_R14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,local_98.name._M_dataplus._M_p,
                 local_98.name._M_dataplus._M_p + local_98.name._M_string_length);
      ts.buffer._0_8_ = local_48._0_8_;
      ts.buffer.value = (double)local_48._8_8_;
      std::__cxx11::string::_M_assign((string *)&ts.buffer.name);
      ts.full = true;
      if (local_38 != unaff_R14) {
        operator_delete(local_38,local_28[0] + 1);
      }
      d = expression();
      goto LAB_00103ef8;
    }
    is_const = false;
  }
  d = declaration(is_const);
LAB_00103ef8:
  if ((-2147483648.0 <= d) && (d <= 2147483647.0)) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name._M_dataplus._M_p != &local_98.name.field_2) {
      operator_delete(local_98.name._M_dataplus._M_p,local_98.name.field_2._M_allocated_capacity + 1
                     );
    }
    return d;
  }
  compose_owerflow_err_msg_abi_cxx11_(&local_68,d);
  error(&local_68);
  uVar1 = std::__cxx11::string::~string((string *)&local_68);
  if (local_38 != unaff_R14) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != &local_98.name.field_2) {
    operator_delete(local_98.name._M_dataplus._M_p,local_98.name.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

double statement()
{
	Token t = ts.get();
	double result = 0;
	switch (t.kind)
	{
	case let:
		result = declaration();
		break;
	case constant:
		result = declaration(true);
		break;
	default:
		ts.unget(t);
		result = expression();
	}

	if (is_out_of_int32_range(result))
		error(compose_owerflow_err_msg(result));
	else
		return result;
}